

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalVector.hpp
# Opt level: O0

void __thiscall
limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::push_back
          (LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *this,
          pair<unsigned_long,_const_cppjieba::DictUnit_*> *t)

{
  long lVar1;
  type in_RSI;
  size_t in_RDI;
  LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *unaff_retaddr;
  
  if (*(long *)(in_RDI + 0x108) == *(long *)(in_RDI + 0x110)) {
    if (*(long *)(in_RDI + 0x110) == 0) {
      __assert_fail("capacity_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/deps/limonp/LocalVector.hpp"
                    ,0x52,
                    "void limonp::LocalVector<std::pair<unsigned long, const cppjieba::DictUnit *>>::push_back(const T &) [T = std::pair<unsigned long, const cppjieba::DictUnit *>]"
                   );
    }
    reserve(unaff_retaddr,in_RDI);
  }
  lVar1 = *(long *)(in_RDI + 0x108);
  *(long *)(in_RDI + 0x108) = lVar1 + 1;
  std::pair<unsigned_long,_const_cppjieba::DictUnit_*>::operator=
            ((pair<unsigned_long,_const_cppjieba::DictUnit_*> *)
             (*(long *)(in_RDI + 0x100) + lVar1 * 0x10),in_RSI);
  return;
}

Assistant:

void push_back(const T& t) {
    if(size_ == capacity_) {
      assert(capacity_);
      reserve(capacity_ * 2);
    }
    ptr_[size_ ++ ] = t;
  }